

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_extension.cpp
# Opt level: O2

void duckdb::ParquetMultiFileInfo::GetVirtualColumns
               (ClientContext *param_1,MultiFileBindData *param_2,virtual_column_map_t *result)

{
  allocator local_c9;
  LogicalType local_c8 [24];
  string local_b0;
  TableColumn local_90;
  pair<unsigned_long,_duckdb::TableColumn> local_58;
  
  std::__cxx11::string::string((string *)&local_b0,"file_row_number",&local_c9);
  duckdb::LogicalType::LogicalType(local_c8,BIGINT);
  TableColumn::TableColumn(&local_90,&local_b0,local_c8);
  std::pair<unsigned_long,_duckdb::TableColumn>::pair<duckdb::TableColumn,_true>
            (&local_58,&MultiFileReader::COLUMN_IDENTIFIER_FILE_ROW_NUMBER,&local_90);
  std::
  _Hashtable<unsigned_long,std::pair<unsigned_long_const,duckdb::TableColumn>,std::allocator<std::pair<unsigned_long_const,duckdb::TableColumn>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_M_emplace<std::pair<unsigned_long,duckdb::TableColumn>>
            ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,duckdb::TableColumn>,std::allocator<std::pair<unsigned_long_const,duckdb::TableColumn>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)result,&local_58);
  TableColumn::~TableColumn(&local_58.second);
  TableColumn::~TableColumn(&local_90);
  duckdb::LogicalType::~LogicalType(local_c8);
  std::__cxx11::string::~string((string *)&local_b0);
  return;
}

Assistant:

void ParquetMultiFileInfo::GetVirtualColumns(ClientContext &, MultiFileBindData &, virtual_column_map_t &result) {
	result.insert(make_pair(MultiFileReader::COLUMN_IDENTIFIER_FILE_ROW_NUMBER,
	                        TableColumn("file_row_number", LogicalType::BIGINT)));
}